

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::TabBarAddTab(ImGuiTabBar *tab_bar,ImGuiTabItemFlags tab_flags,ImGuiWindow *window)

{
  ImGuiID IVar1;
  ImGuiTabItem *pIVar2;
  int iVar3;
  ImGuiTabItem *__dest;
  int iVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  
  IVar1 = window->ID;
  if ((IVar1 != 0) && (lVar5 = (long)(tab_bar->Tabs).Size, 0 < lVar5)) {
    lVar7 = 0;
    do {
      if (*(ImGuiID *)((long)&((tab_bar->Tabs).Data)->ID + lVar7) == IVar1) {
        __assert_fail("TabBarFindTabByID(tab_bar, window->ID) == __null",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui_widgets.cpp"
                      ,0x1c6e,
                      "void ImGui::TabBarAddTab(ImGuiTabBar *, ImGuiTabItemFlags, ImGuiWindow *)");
      }
      lVar7 = lVar7 + 0x30;
    } while (lVar5 * 0x30 != lVar7);
  }
  if (GImGui->CurrentTabBar != tab_bar) {
    iVar8 = tab_bar->CurrFrameVisible;
    if (iVar8 == -1) {
      iVar8 = GImGui->FrameCount + -1;
    }
    iVar3 = (tab_bar->Tabs).Size;
    if (iVar3 == (tab_bar->Tabs).Capacity) {
      if (iVar3 == 0) {
        iVar4 = 8;
      }
      else {
        iVar4 = iVar3 / 2 + iVar3;
      }
      iVar6 = iVar3 + 1;
      if (iVar3 + 1 < iVar4) {
        iVar6 = iVar4;
      }
      __dest = (ImGuiTabItem *)MemAlloc((long)iVar6 * 0x30);
      pIVar2 = (tab_bar->Tabs).Data;
      if (pIVar2 != (ImGuiTabItem *)0x0) {
        memcpy(__dest,pIVar2,(long)(tab_bar->Tabs).Size * 0x30);
        MemFree((tab_bar->Tabs).Data);
      }
      (tab_bar->Tabs).Data = __dest;
      (tab_bar->Tabs).Capacity = iVar6;
      iVar3 = (tab_bar->Tabs).Size;
    }
    else {
      __dest = (tab_bar->Tabs).Data;
    }
    __dest[iVar3].ID = IVar1;
    __dest[iVar3].Flags = tab_flags;
    __dest[iVar3].Window = window;
    __dest[iVar3].LastFrameVisible = iVar8;
    __dest[iVar3].LastFrameSelected = -1;
    pIVar2 = __dest + iVar3;
    pIVar2->ContentWidth = 0.0;
    pIVar2->NameOffset = -1;
    pIVar2->BeginOrder = -1;
    __dest[iVar3].Offset = 0.0;
    __dest[iVar3].Width = 0.0;
    __dest[iVar3].IndexDuringLayout = -1;
    *(undefined4 *)&__dest[iVar3].WantClose = 0;
    *(undefined2 *)&__dest[iVar3].field_0x2e = 0;
    (tab_bar->Tabs).Size = (tab_bar->Tabs).Size + 1;
    return;
  }
  __assert_fail("g.CurrentTabBar != tab_bar",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui_widgets.cpp"
                ,0x1c6f,"void ImGui::TabBarAddTab(ImGuiTabBar *, ImGuiTabItemFlags, ImGuiWindow *)")
  ;
}

Assistant:

void ImGui::TabBarAddTab(ImGuiTabBar* tab_bar, ImGuiTabItemFlags tab_flags, ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(TabBarFindTabByID(tab_bar, window->ID) == NULL);
    IM_ASSERT(g.CurrentTabBar != tab_bar);  // Can't work while the tab bar is active as our tab doesn't have an X offset yet, in theory we could/should test something like (tab_bar->CurrFrameVisible < g.FrameCount) but we'd need to solve why triggers the commented early-out assert in BeginTabBarEx() (probably dock node going from implicit to explicit in same frame)

    ImGuiTabItem new_tab;
    new_tab.ID = window->ID;
    new_tab.Flags = tab_flags;
    new_tab.LastFrameVisible = tab_bar->CurrFrameVisible;   // Required so BeginTabBar() doesn't ditch the tab
    if (new_tab.LastFrameVisible == -1)
        new_tab.LastFrameVisible = g.FrameCount - 1;
    new_tab.Window = window;                                // Required so tab bar layout can compute the tab width before tab submission
    tab_bar->Tabs.push_back(new_tab);
}